

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O2

void dumpStdConnTable(FILE *outf)

{
  StdResConnTableEntry_t *pSVar1;
  ulong uVar2;
  _StdResConnTableEntry **pp_Var3;
  
  for (uVar2 = 0; uVar2 != 0xa39; uVar2 = uVar2 + 1) {
    fprintf((FILE *)outf,"%5d] ",uVar2 & 0xffffffff);
    pp_Var3 = StdResTblBucket + uVar2;
    while (pSVar1 = *pp_Var3, pSVar1 != (StdResConnTableEntry_t *)0x0) {
      fprintf((FILE *)outf,"(\"%s\" --> \"%s\") ",pSVar1->key,pSVar1->value);
      pp_Var3 = &pSVar1->next;
    }
    fputc(10,(FILE *)outf);
  }
  return;
}

Assistant:

void dumpStdConnTable(FILE * outf) {
   int h;
   StdResConnTableEntry_t *t;

   for (h = 0; h < M; h++) {
      fprintf(outf, "%5d] ", h);
      for (t = StdResTblBucket[h]; t; t = t->next) {
	 fprintf(outf, "(\"%s\" --> \"%s\") ", t->key, t->value);
      }
      fprintf(outf, "\n");
   }
}